

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128.cpp
# Opt level: O3

void metrohash128_2(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint8_t *puVar11;
  
  lVar7 = (ulong)seed * 0x30bc5b29 + len;
  lVar9 = (ulong)seed * 0x62992fc1 + len;
  uVar3 = lVar7 + 0xd71aee015be0e9c3;
  uVar6 = lVar9 + 0x3ea66b305d07447b;
  puVar5 = (uint *)key;
  if (0x1f < len) {
    uVar10 = lVar9 + 0x52bc33fedbe4cbb5;
    uVar8 = lVar7 + 0xe108709e144b828d;
    do {
      uVar3 = *(long *)puVar5 * 0xd6d018f5 + uVar3;
      uVar3 = (uVar3 >> 0x1d | uVar3 << 0x23) + uVar10;
      uVar6 = *(long *)(puVar5 + 2) * 0xa2aa033b + uVar6;
      uVar6 = (uVar6 >> 0x1d | uVar6 << 0x23) + uVar8;
      uVar10 = *(long *)(puVar5 + 4) * 0x62992fc1 + uVar10;
      puVar1 = puVar5 + 6;
      puVar5 = puVar5 + 8;
      uVar10 = (uVar10 >> 0x1d | uVar10 << 0x23) + uVar3;
      uVar8 = *(long *)puVar1 * 0x30bc5b29 + uVar8;
      uVar8 = (uVar8 >> 0x1d | uVar8 << 0x23) + uVar6;
    } while (puVar5 <= key + (len - 0x20));
    uVar4 = (uVar8 + uVar3) * 0xd6d018f5 + uVar6;
    uVar10 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0xa2aa033b ^ uVar10;
    uVar4 = (uVar10 + uVar6) * 0xa2aa033b + uVar3;
    uVar8 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0xd6d018f5 ^ uVar8;
    uVar4 = (uVar10 + uVar3) * 0xd6d018f5 + uVar8;
    uVar10 = (uVar8 + uVar6) * 0xa2aa033b + uVar10;
    uVar3 = uVar3 ^ (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0xa2aa033b;
    uVar6 = uVar6 ^ (uVar10 >> 0x21 | uVar10 * 0x80000000) * 0xd6d018f5;
  }
  puVar11 = key + (len - (long)puVar5);
  if (0xf < (long)puVar11) {
    lVar7 = *(long *)puVar5;
    puVar1 = puVar5 + 2;
    puVar5 = puVar5 + 4;
    uVar3 = lVar7 * 0x62992fc1 + uVar3;
    uVar6 = *(long *)puVar1 * 0x62992fc1 + uVar6;
    uVar3 = uVar3 >> 0x1d | uVar3 << 0x23;
    uVar8 = uVar6 >> 0x1d | uVar6 << 0x23;
    uVar6 = uVar8 * 0x30bc5b29;
    uVar10 = uVar3 * 0x12c5448f803e40e9 + uVar6;
    uVar3 = (uVar10 >> 0x1d | uVar10 << 0x23) * 0xa2aa033b ^ uVar3 * 0x30bc5b29;
    uVar10 = uVar8 * 0x9472cc564ae2c91 + uVar3;
    puVar11 = key + (len - (long)puVar5);
    uVar6 = (uVar10 >> 0x1d | uVar10 << 0x23) * 0xd6d018f5 ^ uVar6;
  }
  if (7 < (long)puVar11) {
    lVar7 = *(long *)puVar5;
    puVar5 = puVar5 + 2;
    uVar3 = lVar7 * 0x62992fc1 + uVar3;
    uVar3 = uVar3 >> 0x1d | uVar3 << 0x23;
    uVar10 = uVar3 * 0x12c5448f803e40e9 + uVar6;
    uVar3 = (uVar10 >> 0x1d | uVar10 << 0x23) * 0xa2aa033b ^ uVar3 * 0x30bc5b29;
    puVar11 = key + (len - (long)puVar5);
  }
  if (3 < (long)puVar11) {
    uVar2 = *puVar5;
    puVar5 = puVar5 + 1;
    uVar6 = (ulong)uVar2 * 0x62992fc1 + uVar6;
    uVar6 = uVar6 >> 0x1d | uVar6 << 0x23;
    uVar10 = uVar6 * 0x9472cc564ae2c91 + uVar3;
    uVar6 = (uVar10 >> 0x19 | uVar10 << 0x27) * 0xd6d018f5 ^ uVar6 * 0x30bc5b29;
    puVar11 = key + (len - (long)puVar5);
  }
  if (1 < (long)puVar11) {
    uVar2 = *puVar5;
    puVar5 = (uint *)((long)puVar5 + 2);
    puVar11 = key + (len - (long)puVar5);
    uVar3 = (ulong)(ushort)uVar2 * 0x62992fc1 + uVar3;
    uVar3 = uVar3 >> 0x1d | uVar3 << 0x23;
    uVar10 = uVar3 * 0x12c5448f803e40e9 + uVar6;
    uVar3 = (uVar10 >> 0x1e | uVar10 << 0x22) * 0xa2aa033b ^ uVar3 * 0x30bc5b29;
  }
  if (0 < (long)puVar11) {
    uVar6 = (ulong)(byte)*puVar5 * 0x62992fc1 + uVar6;
    uVar10 = uVar6 >> 0x1d | uVar6 << 0x23;
    uVar6 = uVar10 * 0x9472cc564ae2c91 + uVar3;
    uVar6 = (uVar6 >> 0x12 | uVar6 << 0x2e) * 0xd6d018f5 ^ uVar10 * 0x30bc5b29;
  }
  uVar10 = uVar3 * 0xd6d018f5 + uVar6;
  lVar9 = (uVar10 >> 0x21 | uVar10 * 0x80000000) + uVar3;
  uVar3 = uVar6 * 0xa2aa033b + lVar9;
  lVar7 = (uVar3 >> 0x21 | uVar3 * 0x80000000) + uVar6;
  uVar3 = lVar9 * 0x62992fc1 + lVar7;
  lVar9 = (uVar3 >> 0x21 | uVar3 * 0x80000000) + lVar9;
  uVar3 = lVar7 * 0x30bc5b29 + lVar9;
  *(long *)out = lVar9;
  *(ulong *)(out + 8) = (uVar3 >> 0x21 | uVar3 * 0x80000000) + lVar7;
  return;
}

Assistant:

void metrohash128_2(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xD6D018F5;
    static const uint64_t k1 = 0xA2AA033B;
    static const uint64_t k2 = 0x62992FC1;
    static const uint64_t k3 = 0x30BC5B29; 

    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(key);
    const uint8_t * const end = ptr + len;
    
    uint64_t v[4];
    
    v[0] = ((static_cast<uint64_t>(seed) - k0) * k3) + len;
    v[1] = ((static_cast<uint64_t>(seed) + k1) * k2) + len;
    
    if (len >= 32)
    {        
        v[2] = ((static_cast<uint64_t>(seed) + k0) * k2) + len;
        v[3] = ((static_cast<uint64_t>(seed) - k1) * k3) + len;

        do
        {
            v[0] += read_u64(ptr) * k0; ptr += 8; v[0] = rotate_right(v[0],29) + v[2];
            v[1] += read_u64(ptr) * k1; ptr += 8; v[1] = rotate_right(v[1],29) + v[3];
            v[2] += read_u64(ptr) * k2; ptr += 8; v[2] = rotate_right(v[2],29) + v[0];
            v[3] += read_u64(ptr) * k3; ptr += 8; v[3] = rotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 33) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 33) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 33) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 33) * k0;
    }
    
    if ((end - ptr) >= 16)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],29) * k3;
        v[1] += read_u64(ptr) * k2; ptr += 8; v[1] = rotate_right(v[1],29) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 29) * k1;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 29) * k0;
    }
    
    if ((end - ptr) >= 8)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],29) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 29) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        v[1] += read_u32(ptr) * k2; ptr += 4; v[1] = rotate_right(v[1],29) * k3;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 25) * k0;
    }
    
    if ((end - ptr) >= 2)
    {
        v[0] += read_u16(ptr) * k2; ptr += 2; v[0] = rotate_right(v[0],29) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 30) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
          v[1] += read_u8 (ptr) * k2; v[1] = rotate_right(v[1],29) * k3;
          v[1] ^= rotate_right((v[1] * k3) + v[0], 18) * k0;
    }
    
    v[0] += rotate_right((v[0] * k0) + v[1], 33);
    v[1] += rotate_right((v[1] * k1) + v[0], 33);
    v[0] += rotate_right((v[0] * k2) + v[1], 33);
    v[1] += rotate_right((v[1] * k3) + v[0], 33);

    memcpy(out, v, 16);
}